

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::SetTraceFile(cmake *this,string *file)

{
  ostream *poVar1;
  string local_1c0;
  stringstream ss;
  ostream local_190;
  
  std::ofstream::close();
  std::ofstream::open((char *)&this->TraceFile,(_Ios_Openmode)(file->_M_dataplus)._M_p);
  if (((byte)((this->TraceFile).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3] + 0x20)
             [(long)&(this->TraceFile).super_ofstream.
                     super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream] & 5) !=
      0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar1 = std::operator<<(&local_190,"Error opening trace file ");
    poVar1 = std::operator<<(poVar1,(string *)file);
    poVar1 = std::operator<<(poVar1,": ");
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::operator<<(poVar1,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Trace will be written to ");
  poVar1 = std::operator<<(poVar1,(string *)file);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void cmake::SetTraceFile(const std::string& file)
{
  this->TraceFile.close();
  this->TraceFile.open(file.c_str());
  if (!this->TraceFile) {
    std::stringstream ss;
    ss << "Error opening trace file " << file << ": "
       << cmSystemTools::GetLastSystemError();
    cmSystemTools::Error(ss.str());
    return;
  }
  std::cout << "Trace will be written to " << file << "\n";
}